

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

shared_ptr<mir::inst::PhiInst> ir_phi(VarId *var,int n)

{
  PhiInst *__p;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VarId *in_RSI;
  element_type *in_RDI;
  shared_ptr<mir::inst::PhiInst> sVar1;
  int i;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> vars;
  element_type *this;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffffa0;
  VarId *in_stack_ffffffffffffffa8;
  PhiInst *in_stack_ffffffffffffffb0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffffb8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffffc0;
  undefined4 local_34;
  
  this = in_RDI;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x28011a);
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this,
               (value_type *)in_RDI);
  }
  __p = (PhiInst *)operator_new(0x40);
  mir::inst::VarId::VarId(in_RSI,(VarId *)__p);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  mir::inst::PhiInst::PhiInst
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::shared_ptr<mir::inst::PhiInst>::shared_ptr<mir::inst::PhiInst,void>
            ((shared_ptr<mir::inst::PhiInst> *)in_RSI,__p);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this);
  sVar1.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mir::inst::PhiInst>)
         sVar1.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<mir::inst::PhiInst> ir_phi(mir::inst::VarId var, int n) {
  vector<mir::inst::VarId> vars;
  for (int i = 0; i < n; i++) {
    vars.push_back(var);
  }
  return shared_ptr<mir::inst::PhiInst>(new mir::inst::PhiInst(var, vars));
}